

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_vtlb.c
# Opt level: O0

_Bool unicorn_fill_tlb_mips
                (CPUState *cs,vaddr address,int size,MMUAccessType rw,int mmu_idx,_Bool probe,
                uintptr_t retaddr)

{
  code *pcVar1;
  undefined8 uVar2;
  byte bVar3;
  uc_mem_type uVar4;
  int prot;
  ulong paddr;
  bool bVar5;
  bool bVar6;
  list_item *local_58;
  list_item *cur;
  hook *hook;
  uc_tlb_entry e;
  uc_struct_conflict4 *uc;
  _Bool ret;
  _Bool handled;
  _Bool probe_local;
  int mmu_idx_local;
  MMUAccessType rw_local;
  int size_local;
  vaddr address_local;
  CPUState *cs_local;
  
  bVar6 = false;
  uc._1_1_ = 0;
  e._8_8_ = cs->uc;
  local_58 = ((uc_struct_conflict7 *)e._8_8_)->hook[0x11].head;
  while( true ) {
    uVar2 = e._8_8_;
    bVar5 = false;
    if (local_58 != (list_item *)0x0) {
      cur = (list_item *)local_58->data;
      bVar5 = cur != (list_item *)0x0;
    }
    if (!bVar5) break;
    if (((((ulong)cur[1].next & 0x100000000) == 0) &&
        (((cur[1].data <= address && (address <= cur[2].next)) ||
         (cur[2].next < (list_item *)cur[1].data)))) && (((ulong)cur[1].next & 0x100000000) == 0)) {
      bVar6 = true;
      pcVar1 = (code *)cur[2].data;
      uVar4 = rw_to_mem_type(rw);
      bVar3 = (*pcVar1)(uVar2,address & 0xfffff000,uVar4,&hook,cur[3].next);
      uc._1_1_ = bVar3 & 1;
      if ((bVar3 & 1) != 0) break;
    }
    local_58 = local_58->next;
  }
  if ((!bVar6) || (uc._1_1_ != 0)) {
    if (!bVar6) {
      hook = (hook *)(ulong)((uint)address & 0xfffff000);
      if (rw == MMU_DATA_LOAD) {
        e.paddr._0_4_ = 1;
      }
      else if (rw == MMU_DATA_STORE) {
        e.paddr._0_4_ = 2;
      }
      else if (rw == MMU_INST_FETCH) {
        e.paddr._0_4_ = 4;
      }
      else {
        e.paddr._0_4_ = 0;
      }
    }
    if (rw == MMU_DATA_LOAD) {
      bVar6 = ((uint)e.paddr & 1) != 0;
    }
    else if (rw == MMU_DATA_STORE) {
      bVar6 = ((uint)e.paddr & 2) != 0;
    }
    else if (rw == MMU_INST_FETCH) {
      bVar6 = ((uint)e.paddr & 4) != 0;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      paddr = (ulong)hook & 0xfffff000;
      prot = perms_to_prot((uint)e.paddr);
      tlb_set_page_mips(cs,(uint)address & 0xfffff000,paddr,prot,mmu_idx,0x1000);
      return true;
    }
  }
  if (!probe) {
    raise_mmu_exception(cs,address & 0xffffffff,rw,retaddr);
  }
  return false;
}

Assistant:

bool unicorn_fill_tlb(CPUState *cs, vaddr address, int size,
                      MMUAccessType rw, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    bool handled = false;
    bool ret = false;
    struct uc_struct *uc = cs->uc;
    uc_tlb_entry e;
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;

    HOOK_FOREACH(uc, hook, UC_HOOK_TLB_FILL) {
        if (hook->to_delete) {
            continue;
        }
        if (!HOOK_BOUND_CHECK(hook, address)) {
            continue;
        }
        handled = true;
        if ((ret = ((uc_cb_tlbevent_t)hook->callback)(uc, address & TARGET_PAGE_MASK, rw_to_mem_type(rw), &e, hook->user_data))) {
            break;
        }
    }

    if (handled && !ret) {
        goto tlb_miss;
    }

    if (!handled) {
        e.paddr = address & TARGET_PAGE_MASK;
        switch (rw) {
        case MMU_DATA_LOAD:
            e.perms = UC_PROT_READ;
            break;
        case MMU_DATA_STORE:
            e.perms = UC_PROT_WRITE;
            break;
        case MMU_INST_FETCH:
            e.perms = UC_PROT_EXEC;
            break;
        default:
            e.perms = 0;
            break;
        }
    }

    switch (rw) {
    case MMU_DATA_LOAD:
        ret = e.perms & UC_PROT_READ;
        break;
    case MMU_DATA_STORE:
        ret = e.perms & UC_PROT_WRITE;
        break;
    case MMU_INST_FETCH:
        ret = e.perms & UC_PROT_EXEC;
        break;
    default:
        ret = false;
        break;
    }

    if (ret) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK, e.paddr & TARGET_PAGE_MASK, perms_to_prot(e.perms), mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }

tlb_miss:
    if (probe) {
        return false;
    }
    raise_mmu_exception(cs, address, rw, retaddr);
    return false;
}